

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O2

Type * __thiscall
spvtools::opt::ConvertToHalfPass::FloatVectorType
          (ConvertToHalfPass *this,uint32_t v_len,uint32_t width)

{
  Type *pTVar1;
  TypeManager *this_00;
  Vector vec_ty;
  Vector local_50;
  
  pTVar1 = FloatScalarType(this,width);
  analysis::Vector::Vector(&local_50,pTVar1,v_len);
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  pTVar1 = analysis::TypeManager::GetRegisteredType(this_00,&local_50.super_Type);
  analysis::Type::~Type(&local_50.super_Type);
  return pTVar1;
}

Assistant:

analysis::Type* ConvertToHalfPass::FloatVectorType(uint32_t v_len,
                                                   uint32_t width) {
  analysis::Type* reg_float_ty = FloatScalarType(width);
  analysis::Vector vec_ty(reg_float_ty, v_len);
  return context()->get_type_mgr()->GetRegisteredType(&vec_ty);
}